

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EmitBuffer.cpp
# Opt level: O0

void __thiscall
EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
::DumpAndResetStats(EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
                    *this,char16 *filename)

{
  ulong uVar1;
  float local_bc;
  float local_a0;
  float local_94;
  float local_84;
  float local_78;
  float local_58;
  float local_48;
  float local_2c;
  size_t wasted;
  char16 *filename_local;
  EmitBufferManager<Memory::VirtualAllocWrapper,_Memory::PreReservedVirtualAllocWrapper,_CriticalSection>
  *this_local;
  
  if (this->totalBytesCommitted != 0) {
    uVar1 = (this->totalBytesCommitted - this->totalBytesCode) - this->totalBytesAlignment;
    Output::Print(L"Stats for %s: %s \n",this->name,filename);
    local_2c = (float)this->totalBytesCode;
    local_48 = (float)this->totalBytesCommitted;
    Output::Print(L"  Total code size      : %10d (%6.2f%% of committed)\n",
                  (double)((local_2c * 100.0) / local_48),this->totalBytesCode);
    Output::Print(L"  Total LoopBody code  : %10d\n",this->totalBytesLoopBody);
    local_58 = (float)this->totalBytesAlignment;
    local_78 = (float)this->totalBytesCommitted;
    Output::Print(L"  Total alignment size : %10d (%6.2f%% of committed)\n",
                  (double)((local_58 * 100.0) / local_78),this->totalBytesAlignment);
    local_84 = (float)uVar1;
    local_94 = (float)this->totalBytesCommitted;
    Output::Print(L"  Total wasted size    : %10d (%6.2f%% of committed)\n",
                  (double)((local_84 * 100.0) / local_94),uVar1);
    local_a0 = (float)this->totalBytesCommitted;
    local_bc = (float)this->totalBytesReserved;
    Output::Print(L"  Total committed size : %10d (%6.2f%% of reserved)\n",
                  (double)((local_a0 * 100.0) / local_bc),this->totalBytesCommitted);
    Output::Print(L"  Total reserved size  : %10d\n",this->totalBytesReserved);
  }
  this->totalBytesCode = 0;
  this->totalBytesLoopBody = 0;
  this->totalBytesAlignment = 0;
  this->totalBytesCommitted = 0;
  this->totalBytesReserved = 0;
  return;
}

Assistant:

void
EmitBufferManager<TAlloc, TPreReservedAlloc, SyncObject>::DumpAndResetStats(char16 const * filename)
{
    if (this->totalBytesCommitted != 0)
    {
        size_t wasted = this->totalBytesCommitted - this->totalBytesCode - this->totalBytesAlignment;
        Output::Print(_u("Stats for %s: %s \n"), name, filename);
        Output::Print(_u("  Total code size      : %10d (%6.2f%% of committed)\n"), this->totalBytesCode,
            (float)this->totalBytesCode * 100 / this->totalBytesCommitted);
        Output::Print(_u("  Total LoopBody code  : %10d\n"), this->totalBytesLoopBody);
        Output::Print(_u("  Total alignment size : %10d (%6.2f%% of committed)\n"), this->totalBytesAlignment,
            (float)this->totalBytesAlignment * 100 / this->totalBytesCommitted);
        Output::Print(_u("  Total wasted size    : %10d (%6.2f%% of committed)\n"), wasted,
            (float)wasted * 100 / this->totalBytesCommitted);
        Output::Print(_u("  Total committed size : %10d (%6.2f%% of reserved)\n"), this->totalBytesCommitted,
            (float)this->totalBytesCommitted * 100 / this->totalBytesReserved);
        Output::Print(_u("  Total reserved size  : %10d\n"), this->totalBytesReserved);
    }
    this->totalBytesCode = 0;
    this->totalBytesLoopBody = 0;
    this->totalBytesAlignment = 0;
    this->totalBytesCommitted = 0;
    this->totalBytesReserved = 0;
}